

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wdgl.cpp
# Opt level: O1

void * rw::wdgl::skinOpen(void *o,int32 param_2,int32 param_3)

{
  DAT_0014a2d0 = makeSkinPipeline();
  return o;
}

Assistant:

static void*
skinOpen(void *o, int32, int32)
{
	skinGlobals.pipelines[PLATFORM_WDGL] = makeSkinPipeline();
	return o;
}